

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Option.hpp
# Opt level: O0

Option * __thiscall CLI::Option::requires<CLI::App>(Option *this,string *opt_name)

{
  bool bVar1;
  vector<std::unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_>,_std::allocator<std::unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_>_>_>
  *this_00;
  pointer pOVar2;
  Option *pOVar3;
  IncorrectConstruction *__return_storage_ptr__;
  bool local_a9;
  string local_90;
  byte local_59;
  string local_58;
  unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_> *local_38;
  Option_p *opt;
  iterator __end0;
  iterator __begin0;
  vector<std::unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_>,_std::allocator<std::unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_>_>_>
  *__range2;
  string *opt_name_local;
  Option *this_local;
  
  this_00 = &this->parent_->options_;
  __end0 = std::
           vector<std::unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_>,_std::allocator<std::unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_>_>_>
           ::begin(this_00);
  opt = (Option_p *)
        std::
        vector<std::unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_>,_std::allocator<std::unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_>_>_>
        ::end(this_00);
  while( true ) {
    bVar1 = __gnu_cxx::operator!=
                      (&__end0,(__normal_iterator<std::unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_>_*,_std::vector<std::unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_>,_std::allocator<std::unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_>_>_>_>
                                *)&opt);
    if (!bVar1) {
      __return_storage_ptr__ = (IncorrectConstruction *)__cxa_allocate_exception(0x38);
      ::std::__cxx11::string::string((string *)&local_90,(string *)opt_name);
      IncorrectConstruction::MissingOption(__return_storage_ptr__,&local_90);
      __cxa_throw(__return_storage_ptr__,&IncorrectConstruction::typeinfo,
                  IncorrectConstruction::~IncorrectConstruction);
    }
    local_38 = __gnu_cxx::
               __normal_iterator<std::unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_>_*,_std::vector<std::unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_>,_std::allocator<std::unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_>_>_>_>
               ::operator*(&__end0);
    pOVar2 = std::unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_>::get(local_38);
    local_59 = 0;
    local_a9 = false;
    if (pOVar2 != this) {
      pOVar2 = std::unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_>::operator->(local_38)
      ;
      ::std::__cxx11::string::string((string *)&local_58,(string *)opt_name);
      local_59 = 1;
      local_a9 = check_name(pOVar2,&local_58);
    }
    if ((local_59 & 1) != 0) {
      ::std::__cxx11::string::~string((string *)&local_58);
    }
    if (local_a9 != false) break;
    __gnu_cxx::
    __normal_iterator<std::unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_>_*,_std::vector<std::unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_>,_std::allocator<std::unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_>_>_>_>
    ::operator++(&__end0);
  }
  pOVar2 = std::unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_>::get(local_38);
  pOVar3 = requires(this,pOVar2);
  return pOVar3;
}

Assistant:

Option *requires(std::string opt_name) {
        for(const Option_p &opt : dynamic_cast<T *>(parent_)->options_)
            if(opt.get() != this && opt->check_name(opt_name))
                return requires(opt.get());
        throw IncorrectConstruction::MissingOption(opt_name);
    }